

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode chop_write(connectdata *conn,int type,char *optr,size_t olen)

{
  Curl_easy *data_00;
  CURLcode CVar1;
  size_t sVar2;
  size_t local_80;
  curl_write_callback local_78;
  size_t wrote_1;
  size_t wrote;
  size_t chunklen;
  size_t len;
  char *ptr;
  curl_write_callback writebody;
  curl_write_callback writeheader;
  Curl_easy *data;
  size_t olen_local;
  char *optr_local;
  int type_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  writebody = (curl_write_callback)0x0;
  ptr = (char *)0x0;
  if (olen == 0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else if (((data_00->req).keepon & 0x10U) == 0) {
    if ((type & 1U) != 0) {
      ptr = (char *)(data_00->set).fwrite_func;
    }
    chunklen = olen;
    len = (size_t)optr;
    if (((type & 2U) != 0) &&
       (((data_00->set).fwrite_header != (curl_write_callback)0x0 ||
        ((data_00->set).writeheader != (void *)0x0)))) {
      if ((data_00->set).fwrite_header == (curl_write_callback)0x0) {
        local_78 = (data_00->set).fwrite_func;
      }
      else {
        local_78 = (data_00->set).fwrite_header;
      }
      writebody = local_78;
    }
    for (; chunklen != 0; chunklen = chunklen - local_80) {
      if (chunklen < 0x4001) {
        local_80 = chunklen;
      }
      else {
        local_80 = 0x4000;
      }
      if (ptr != (char *)0x0) {
        sVar2 = (*(code *)ptr)(len,1,local_80,(data_00->set).out);
        if (sVar2 == 0x10000001) {
          if ((conn->handler->flags & 0x10) != 0) {
            Curl_failf(data_00,"Write callback asked for PAUSE when not supported!");
            return CURLE_WRITE_ERROR;
          }
          CVar1 = pausewrite(data_00,type,(char *)len,chunklen);
          return CVar1;
        }
        if (sVar2 != local_80) {
          Curl_failf(data_00,"Failed writing body (%zu != %zu)",sVar2,local_80);
          return CURLE_WRITE_ERROR;
        }
      }
      len = local_80 + len;
    }
    if (writebody != (curl_write_callback)0x0) {
      Curl_set_in_callback(data_00,true);
      sVar2 = (*writebody)(optr,1,olen,(data_00->set).writeheader);
      Curl_set_in_callback(data_00,false);
      if (sVar2 == 0x10000001) {
        CVar1 = pausewrite(data_00,2,optr,olen);
        return CVar1;
      }
      if (sVar2 != olen) {
        Curl_failf(data_00,"Failed writing header");
        return CURLE_WRITE_ERROR;
      }
    }
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    conn_local._4_4_ = pausewrite(data_00,type,optr,olen);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode chop_write(struct connectdata *conn,
                           int type,
                           char *optr,
                           size_t olen)
{
  struct Curl_easy *data = conn->data;
  curl_write_callback writeheader = NULL;
  curl_write_callback writebody = NULL;
  char *ptr = optr;
  size_t len = olen;

  if(!len)
    return CURLE_OK;

  /* If reading is paused, append this data to the already held data for this
     type. */
  if(data->req.keepon & KEEP_RECV_PAUSE)
    return pausewrite(data, type, ptr, len);

  /* Determine the callback(s) to use. */
  if(type & CLIENTWRITE_BODY)
    writebody = data->set.fwrite_func;
  if((type & CLIENTWRITE_HEADER) &&
     (data->set.fwrite_header || data->set.writeheader)) {
    /*
     * Write headers to the same callback or to the especially setup
     * header callback function (added after version 7.7.1).
     */
    writeheader =
      data->set.fwrite_header? data->set.fwrite_header: data->set.fwrite_func;
  }

  /* Chop data, write chunks. */
  while(len) {
    size_t chunklen = len <= CURL_MAX_WRITE_SIZE? len: CURL_MAX_WRITE_SIZE;

    if(writebody) {
      size_t wrote = writebody(ptr, 1, chunklen, data->set.out);

      if(CURL_WRITEFUNC_PAUSE == wrote) {
        if(conn->handler->flags & PROTOPT_NONETWORK) {
          /* Protocols that work without network cannot be paused. This is
             actually only FILE:// just now, and it can't pause since the
             transfer isn't done using the "normal" procedure. */
          failf(data, "Write callback asked for PAUSE when not supported!");
          return CURLE_WRITE_ERROR;
        }
        return pausewrite(data, type, ptr, len);
      }
      if(wrote != chunklen) {
        failf(data, "Failed writing body (%zu != %zu)", wrote, chunklen);
        return CURLE_WRITE_ERROR;
      }
    }

    ptr += chunklen;
    len -= chunklen;
  }

  if(writeheader) {
    size_t wrote;
    ptr = optr;
    len = olen;
    Curl_set_in_callback(data, true);
    wrote = writeheader(ptr, 1, len, data->set.writeheader);
    Curl_set_in_callback(data, false);

    if(CURL_WRITEFUNC_PAUSE == wrote)
      /* here we pass in the HEADER bit only since if this was body as well
         then it was passed already and clearly that didn't trigger the
         pause, so this is saved for later with the HEADER bit only */
      return pausewrite(data, CLIENTWRITE_HEADER, ptr, len);

    if(wrote != len) {
      failf(data, "Failed writing header");
      return CURLE_WRITE_ERROR;
    }
  }

  return CURLE_OK;
}